

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  uint uVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  size_t sVar4;
  ostream *poVar5;
  bool bVar6;
  uint uVar7;
  ostream *poVar8;
  char *__s;
  Message buffer;
  string error_message;
  DummyMatchResultListener dummy;
  string local_200;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  string local_198 [3];
  ios_base local_128 [264];
  
  if (this->spawned_ != true) {
    return false;
  }
  (*(this->super_DeathTest)._vptr_DeathTest[6])(&local_1d8,this);
  Message::Message((Message *)&local_1e0);
  poVar5 = (ostream *)(local_1e0._M_head_impl + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Death test: ",0xc);
  __s = this->statement_;
  if (__s == (char *)0x0) {
    sVar4 = 6;
    __s = "(null)";
  }
  else {
    sVar4 = strlen(__s);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,__s,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  switch(this->outcome_) {
  case DIED:
    if (!status_ok) {
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"    Result: died but not with expected exit code:\n",0x32);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"            ",0xc);
      uVar1 = this->status_;
      Message::Message((Message *)&local_200);
      uVar7 = uVar1 & 0x7f;
      if (uVar7 == 0) {
        poVar8 = (ostream *)(local_200._M_dataplus._M_p + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Exited with exit status ",0x18);
        std::ostream::operator<<((ostream *)poVar8,uVar1 >> 8 & 0xff);
      }
      else if (0x1ffffff < (int)(uVar7 * 0x1000000 + 0x1000000)) {
        poVar8 = (ostream *)(local_200._M_dataplus._M_p + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Terminated by signal ",0x15);
        std::ostream::operator<<((ostream *)poVar8,uVar7);
      }
      if ((char)uVar1 < '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_200._M_dataplus._M_p + 0x10)," (core dumped)",0xe);
      }
      _Var2._M_p = local_200._M_dataplus._M_p;
      StringStreamToString(local_198,(stringstream *)local_200._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)_Var2._M_p + 8))(_Var2._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,local_198[0]._M_dataplus._M_p,local_198[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Actual msg:\n",0xc);
      FormatDeathTestOutput(&local_200,&local_1d8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,local_200._M_dataplus._M_p,local_200._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      break;
    }
    local_198[0]._M_string_length = 0;
    local_198[0]._M_dataplus._M_p = (pointer)&PTR__MatchResultListener_0015b6c0;
    bVar3 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            ::MatchAndExplain(&(this->matcher_).
                               super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              ,&local_1d8,(MatchResultListener *)local_198);
    bVar6 = true;
    if (bVar3) goto LAB_0012cf0e;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::DescribeTo(&(this->matcher_).
                  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 ,(ostream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"    Result: died but not with expected error.\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  Expected: ",0xc);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_200._M_dataplus._M_p,local_200._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Actual msg:\n",0xc);
    FormatDeathTestOutput(&local_1b8,&local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
    goto LAB_0012cf0c;
  case LIVED:
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    Result: failed to die.\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," Error msg:\n",0xc);
    FormatDeathTestOutput(local_198,&local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_198[0]._M_dataplus._M_p,local_198[0]._M_string_length);
    break;
  case RETURNED:
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"    Result: illegal return in test statement.\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," Error msg:\n",0xc);
    FormatDeathTestOutput(local_198,&local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_198[0]._M_dataplus._M_p,local_198[0]._M_string_length);
    break;
  case THREW:
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"    Result: threw an exception.\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," Error msg:\n",0xc);
    FormatDeathTestOutput(local_198,&local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_198[0]._M_dataplus._M_p,local_198[0]._M_string_length);
    break;
  default:
    GTestLog::GTestLog((GTestLog *)local_198,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/externalLibs/googletest/googletest/src/gtest-death-test.cc"
                       ,0x265);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DeathTest::Passed somehow called before conclusion of test",
               0x3a);
    GTestLog::~GTestLog((GTestLog *)local_198);
    goto LAB_0012cf0c;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != &local_198[0].field_2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
LAB_0012cf0c:
  bVar6 = false;
LAB_0012cf0e:
  StringStreamToString(local_198,local_1e0._M_head_impl);
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != &local_198[0].field_2) {
    operator_delete(local_198[0]._M_dataplus._M_p,local_198[0].field_2._M_allocated_capacity + 1);
  }
  if (local_1e0._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_1e0._M_head_impl + 8))(local_1e0._M_head_impl);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const std::string error_message = GetErrorLogs();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        if (matcher_.Matches(error_message)) {
          success = true;
        } else {
          std::ostringstream stream;
          matcher_.DescribeTo(&stream);
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << stream.str() << "\n"
                 << "Actual msg:\n"
                 << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}